

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase321::run(TestCase321 *this)

{
  Reader reader_00;
  Builder builder_00;
  size_t sVar1;
  size_t sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t extraout_RDX;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  ReaderOptions options;
  TestPipe pipe;
  TestMessageBuilder builder;
  PackedMessageReader reader;
  undefined1 local_320 [8];
  OutputStream OStack_318;
  WirePointer *local_310;
  _Alloc_hider local_308;
  uchar *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  size_type local_2e8;
  StructBuilder local_2e0;
  Reader local_2b8;
  StructReader local_298;
  SegmentReader *local_268;
  CapTableReader *in_stack_fffffffffffffda0;
  WirePointer *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined **ppuVar6;
  PackedMessageReader local_148;
  size_t extraout_RDX_00;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&stack0xfffffffffffffdc0,0,FIXED_SIZE);
  ppuVar6 = &PTR__TestMessageBuilder_00374a38;
  MessageBuilder::getRootInternal((Builder *)local_320,(MessageBuilder *)&stack0xfffffffffffffdc0);
  local_148.super_InputStreamMessageReader.super_MessageReader._vptr_MessageReader =
       (_func_int **)local_310;
  local_148.super_PackedInputStream.super_InputStream._vptr_InputStream = (_func_int **)local_320;
  local_148.super_PackedInputStream.inner = (BufferedInputStream *)OStack_318._vptr_OutputStream;
  PointerBuilder::initStruct(&local_2e0,(PointerBuilder *)&local_148,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffda8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffda0;
  builder_00._builder.data = (void *)in_stack_fffffffffffffdb0;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffdb8;
  builder_00._builder._32_8_ = ppuVar6;
  initTestMessage(builder_00);
  paVar3 = &local_2f8;
  local_320 = (undefined1  [8])&PTR__TestPipe_00374960;
  OStack_318._vptr_OutputStream = (_func_int **)&PTR__TestPipe_003749a0;
  local_310 = (WirePointer *)0xffffffffffffffff;
  local_300 = (uchar *)0x0;
  local_2f8._M_local_buf[0] = '\0';
  local_2e8 = 0;
  local_308._M_p = (pointer)paVar3;
  AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&stack0xfffffffffffffdc0);
  AVar5.ptr = (ArrayPtr<const_capnp::word> *)AVar4.size_;
  AVar5.size_ = (size_t)paVar3;
  writePackedMessage((capnp *)&OStack_318,(OutputStream *)AVar4.ptr,AVar5);
  AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&stack0xfffffffffffffdc0);
  AVar4.size_ = (ArrayPtr<const_capnp::word> *)AVar5.size_;
  AVar4.ptr = AVar4.size_;
  sVar1 = computeSerializedSizeInWords((capnp *)AVar5.ptr,AVar4);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = local_300;
  sVar2 = computeUnpackedSizeInWords((capnp *)local_308._M_p,packedBytes);
  if ((sVar1 != sVar2) && (kj::_::Debug::minSeverity < 3)) {
    AVar4 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&stack0xfffffffffffffdc0);
    segments.size_ = (ArrayPtr<const_capnp::word> *)AVar4.size_;
    segments.ptr = segments.size_;
    local_148.super_PackedInputStream.super_InputStream._vptr_InputStream =
         (_func_int **)computeSerializedSizeInWords((capnp *)AVar4.ptr,segments);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = local_300;
    local_268 = (SegmentReader *)computeUnpackedSizeInWords((capnp *)local_308._M_p,packedBytes_00);
    kj::_::Debug::log<char_const(&)[106],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,0x148,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(unsigned_long *)&local_148,(unsigned_long *)&local_268);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  PackedMessageReader::PackedMessageReader
            (&local_148,(BufferedInputStream *)local_320,options,(ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRootInternal
            (&local_2b8,&local_148.super_InputStreamMessageReader.super_MessageReader);
  local_268 = local_2b8.reader.segment;
  PointerReader::getStruct(&local_298,(PointerReader *)&local_268,(word *)0x0);
  reader_00._reader.capTable = local_298.capTable;
  reader_00._reader.segment = local_298.segment;
  reader_00._reader.data = local_298.data;
  reader_00._reader.pointers = local_298.pointers;
  reader_00._reader.dataSize = local_298.dataSize;
  reader_00._reader.pointerCount = local_298.pointerCount;
  reader_00._reader._38_2_ = local_298._38_2_;
  reader_00._reader.nestingLimit = local_298.nestingLimit;
  reader_00._reader._44_4_ = local_298._44_4_;
  checkTestMessage(reader_00);
  PackedMessageReader::~PackedMessageReader(&local_148);
  TestPipe::~TestPipe((TestPipe *)local_320);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)&stack0xfffffffffffffdc0);
  return;
}

Assistant:

TEST(Packed, RoundTripEvenSegmentCount) {
  TestMessageBuilder builder(10);
  initTestMessage(builder.initRoot<TestAllTypes>());

  TestPipe pipe;
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  checkTestMessage(reader.getRoot<TestAllTypes>());
}